

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream_demultiplexer.h
# Opt level: O3

StreamDemultiplexer * __thiscall
StreamDemultiplexer::operator<<(StreamDemultiplexer *this,char (*obj) [3])

{
  ostream *poVar1;
  size_t sVar2;
  pointer ppbVar3;
  
  ppbVar3 = (this->d).
            super__Vector_base<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (ppbVar3 !=
      (this->d).
      super__Vector_base<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    do {
      poVar1 = *ppbVar3;
      sVar2 = strlen(*obj);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,*obj,sVar2);
      ppbVar3 = ppbVar3 + 1;
    } while (ppbVar3 !=
             (this->d).
             super__Vector_base<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  }
  return this;
}

Assistant:

StreamDemultiplexer& operator<<(const T& obj)
    {
        for (str_cont::iterator it = d.begin(); it != d.end(); ++it)
            (**it) << obj;
        return *this;
    }